

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<5>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  int *piVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  piVar1 = Get<int>(ptr);
  io::CodedOutputStream::WriteVarint32SignExtended(output,*piVar1);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt32NoTag(Get<int32>(ptr), output);
  }